

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

void __thiscall
ON_BinaryFile::ON_BinaryFile
          (ON_BinaryFile *this,archive_mode archive_mode,wchar_t *file_system_path)

{
  FILE *pFVar1;
  uint uVar2;
  
  ON_BinaryArchive::ON_BinaryArchive(&this->super_ON_BinaryArchive,archive_mode);
  (this->super_ON_BinaryArchive)._vptr_ON_BinaryArchive = (_func_int **)&PTR__ON_BinaryFile_00819bf0
  ;
  this->m_fp = (FILE *)0x0;
  this->m_bCloseFileInDestructor = false;
  this->m_memory_buffer_capacity = 0;
  this->m_memory_buffer_size = 0;
  this->m_memory_buffer_ptr = 0;
  this->m_memory_buffer = (uchar *)0x0;
  uVar2 = archive_mode - read;
  if ((uVar2 < 6) && ((0x33U >> (uVar2 & 0x1f) & 1) != 0)) {
    pFVar1 = ON::OpenFile(file_system_path,
                          (wchar_t *)(&DAT_006aa010 + *(int *)(&DAT_006aa010 + (ulong)uVar2 * 4)));
    this->m_fp = pFVar1;
  }
  if (this->m_fp == (FILE *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x4106,"","Invalid parameters");
  }
  else {
    this->m_bCloseFileInDestructor = true;
  }
  return;
}

Assistant:

ON_BinaryFile::ON_BinaryFile( ON::archive_mode archive_mode, const wchar_t* file_system_path ) 
  : ON_BinaryArchive( archive_mode )
{
  switch (archive_mode)
  {
  case ON::archive_mode::unset_archive_mode:
    break;
  case ON::archive_mode::read:
  case ON::archive_mode::read3dm:
    m_fp = ON::OpenFile(file_system_path,L"rb");
    break;
  case ON::archive_mode::write:
  case ON::archive_mode::write3dm:
    m_fp = ON::OpenFile(file_system_path,L"wb");
    break;
  default:
    break;
  }
  if ( nullptr != m_fp )
    m_bCloseFileInDestructor = true;
  else
  {
    ON_ERROR("Invalid parameters");
  }
}